

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolicyGraph.cpp
# Opt level: O1

History * pgi::get_history(History *__return_storage_ptr__,path_t *p,PolicyGraph *g)

{
  pointer *ppAVar1;
  pointer peVar2;
  iterator __position;
  edge_desc_impl<boost::bidirectional_tag,_unsigned_long> *e;
  pointer peVar3;
  ActionObservation local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<pgi::ActionObservation,_std::allocator<pgi::ActionObservation>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<pgi::ActionObservation,_std::allocator<pgi::ActionObservation>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<pgi::ActionObservation,_std::allocator<pgi::ActionObservation>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<pgi::ActionObservation,_std::allocator<pgi::ActionObservation>_>::reserve
            (__return_storage_ptr__,
             ((long)(p->
                    super__Vector_base<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(p->
                    super__Vector_base<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  peVar2 = (p->
           super__Vector_base<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (peVar3 = (p->
                super__Vector_base<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>_>_>
                )._M_impl.super__Vector_impl_data._M_start; peVar3 != peVar2; peVar3 = peVar3 + 1) {
    local_38.action_index_ =
         (g->super_type).m_vertices.
         super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>::config::stored_vertex>_>
         ._M_impl.super__Vector_impl_data._M_start
         [(peVar3->super_edge_base<boost::bidirectional_tag,_unsigned_long>).m_source].
         super_StoredVertex.m_property;
    local_38.observation_index_ = *peVar3->m_eproperty;
    __position._M_current =
         (__return_storage_ptr__->
         super__Vector_base<pgi::ActionObservation,_std::allocator<pgi::ActionObservation>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<pgi::ActionObservation,_std::allocator<pgi::ActionObservation>_>)._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      std::vector<pgi::ActionObservation,_std::allocator<pgi::ActionObservation>_>::
      _M_realloc_insert<pgi::ActionObservation>(__return_storage_ptr__,__position,&local_38);
    }
    else {
      (__position._M_current)->action_index_ = local_38.action_index_;
      (__position._M_current)->observation_index_ = local_38.observation_index_;
      ppAVar1 = &(__return_storage_ptr__->
                 super__Vector_base<pgi::ActionObservation,_std::allocator<pgi::ActionObservation>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

History get_history(const path_t& p, const PolicyGraph& g) {
  History h;
  h.reserve(p.size());
  for (const auto& e : p) {
    h.emplace_back(ActionObservation{g[boost::source(e, g)], g[e]});
  }
  return h;
}